

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool test_SSTable_input(void)

{
  long lVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::list<int,_std::allocator<int>_>_> __l_01;
  allocator_type local_93;
  allocator_type local_92;
  allocator_type local_91;
  _List_base<int,_std::allocator<int>_> local_90;
  list<int,_std::allocator<int>_> local_78;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  l;
  int local_48 [8];
  int local_28 [6];
  
  local_28[0] = 1;
  local_28[1] = 2;
  local_28[2] = 3;
  local_28[3] = 4;
  local_28[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_28;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_90,__l,&local_91);
  local_48[0] = 6;
  local_48[1] = 7;
  local_48[2] = 8;
  local_48[3] = 9;
  local_48[4] = 10;
  __l_00._M_len = 5;
  __l_00._M_array = local_48;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_78,__l_00,&local_92);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_90;
  std::__cxx11::
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::list(&l,__l_01,&local_93);
  lVar1 = 0x18;
  do {
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              ((_List_base<int,_std::allocator<int>_> *)
               ((long)&local_90._M_impl._M_node.super__List_node_base._M_next + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&l.
              super__List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
            );
  return true;
}

Assistant:

bool test_SSTable_input() {
    auto l = std::list<std::list<int>>{{1, 2, 3, 4, 5},
                                       {6, 7, 8, 9, 10}};
    return true;
}